

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O0

bool compare_xmlNode_has_attribute_equal_to(Constraint *constraint,CgreenValue actual)

{
  int iVar1;
  xmlChar *pxVar2;
  long in_RDI;
  bool ret;
  xmlChar *actualValue;
  xmlNode_has_attribute_equal_to *expected;
  xmlNodePtr actualNode;
  xmlChar *in_stack_ffffffffffffffe0;
  xmlNodePtr node;
  
  node = *(xmlNodePtr *)(in_RDI + 0x48);
  pxVar2 = getAttribute(node,in_stack_ffffffffffffffe0);
  iVar1 = xmlStrEqual(pxVar2,*(undefined8 *)&node->type);
  (*_xmlFree)(pxVar2);
  return iVar1 != 0;
}

Assistant:

static bool compare_xmlNode_has_attribute_equal_to(Constraint *constraint,
                                                   CgreenValue actual) {
    xmlNodePtr actualNode =  (xmlNodePtr)actual.value.pointer_value;
    struct xmlNode_has_attribute_equal_to *expected =
        (struct xmlNode_has_attribute_equal_to*)constraint->expected_value.value.pointer_value;
    xmlChar* actualValue = getAttribute(actualNode, expected->attr);

    bool ret = xmlStrEqual(actualValue, expected->value);
    xmlFree(actualValue);
    return ret;
}